

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O2

Activation * __thiscall
notch::io::PlainTextNetworkReader::getActivation(PlainTextNetworkReader *this,string *tag)

{
  bool bVar1;
  undefined1 *puVar2;
  
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tag,
                          "tanh");
  if (bVar1) {
    puVar2 = core::defaultTanh;
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)tag
                            ,"scaledTanh");
    if (bVar1) {
      puVar2 = core::scaledTanh;
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              tag,"linear");
      if (bVar1) {
        puVar2 = core::linearActivation;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )tag,"ReLU");
        if (bVar1) {
          puVar2 = core::ReLU;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)tag,"leakyReLU");
          puVar2 = (undefined1 *)0x0;
          if (bVar1) {
            puVar2 = core::leakyReLU;
          }
        }
      }
    }
  }
  return (Activation *)puVar2;
}

Assistant:

const Activation *getActivation(const std::string &tag) {
        if (tag == "tanh") {
            return &defaultTanh;
        } else if (tag == "scaledTanh") {
            return &scaledTanh;
        } else if (tag == "linear") {
            return &linearActivation;
        } else if (tag == "ReLU") {
            return &ReLU;
        } else if (tag == "leakyReLU") {
            return &leakyReLU;
        }  else {
            return nullptr;
        }
    }